

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees_emit.h
# Opt level: O1

void zng_tr_align(deflate_state *s)

{
  uint uVar1;
  byte bVar2;
  uint64_t bi_buf;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = s->bi_valid;
  uVar3 = s->bi_buf;
  uVar4 = uVar1 + 3;
  bVar2 = (byte)uVar1;
  if ((uVar4 | uVar1) < 0x40) {
    uVar3 = 2L << (bVar2 & 0x3f) | uVar3;
  }
  else if (uVar1 < 0x40) {
    *(ulong *)(s->pending_buf + s->pending) = 2L << (bVar2 & 0x3f) | uVar3;
    s->pending = s->pending + 8;
    uVar3 = 2L >> (-bVar2 & 0x3f);
    uVar4 = uVar1 - 0x3d;
  }
  else {
    *(ulong *)(s->pending_buf + s->pending) = uVar3;
    s->pending = s->pending + 8;
    uVar4 = 3;
    uVar3 = 2;
  }
  s->bi_valid = uVar4;
  s->bi_buf = uVar3;
  uVar1 = uVar4 + 7;
  if (0x3f < (uVar1 | uVar4)) {
    *(ulong *)(s->pending_buf + s->pending) = uVar3;
    s->pending = s->pending + 8;
    uVar1 = 7;
    if (uVar4 < 0x40) {
      uVar1 = uVar4 - 0x39;
    }
    uVar3 = 0;
  }
  s->bi_valid = uVar1;
  s->bi_buf = uVar3;
  zng_tr_flush_bits(s);
  return;
}

Assistant:

static inline void zng_tr_emit_tree(deflate_state *s, int type, const int last) {
    uint32_t bi_valid = s->bi_valid;
    uint64_t bi_buf = s->bi_buf;
    uint32_t header_bits = (type << 1) + last;
    send_bits(s, header_bits, 3, bi_buf, bi_valid);
    cmpr_bits_add(s, 3);
    s->bi_valid = bi_valid;
    s->bi_buf = bi_buf;
    Tracev((stderr, "\n--- Emit Tree: Last: %u\n", last));
}